

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createImageViewTests(TestContext *testCtx)

{
  VkImageViewType viewType;
  VkFormat format;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pVVar4;
  TestCaseGroup *pTVar5;
  bool bVar6;
  int channelNdx;
  uint uVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  char *__rhs;
  TestNode *pTVar10;
  ostream *poVar11;
  ImageViewTest *pIVar12;
  long lVar13;
  long lVar14;
  VkComponentSwizzle componentSwizzle;
  VkComponentSwizzle componentSwizzle_00;
  VkComponentSwizzle componentSwizzle_01;
  VkComponentSwizzle componentSwizzle_02;
  int firstChannelNdx;
  deUint32 dVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  TestCaseConfig config;
  vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> componentMappings;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> subresourceRangeTests;
  TestCaseConfig arrayRangeCases [3];
  TestCaseConfig arrayRangeCases_2 [2];
  TestCaseConfig config_16;
  TestCaseConfig mipLevelAndArrayRangeCases [4];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> componentSwizzleTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTests;
  VkImageSubresourceRange subresourceRange;
  string fullName;
  
  pTVar8 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar8,testCtx,"image_view","Image tests");
  imageTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar8;
  pTVar8 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar8,testCtx,"view_type","");
  lVar17 = 0;
  viewTypeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar8;
  do {
    pTVar8 = viewTypeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if (lVar17 == 7) {
      viewTypeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(imageTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
      pTVar8 = imageTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      imageTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&viewTypeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&imageTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar8;
    }
    viewType = (&DAT_00bfb810)[lVar17 * 4];
    pTVar8 = (TestCaseGroup *)operator_new(0x70);
    pcVar9 = (char *)(&DAT_00bfb818)[lVar17 * 2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)arrayRangeCases,"Uses a ",(allocator<char> *)&config_16);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   mipLevelAndArrayRangeCases,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   arrayRangeCases,pcVar9);
    std::operator+(&fullName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   mipLevelAndArrayRangeCases," view");
    tcu::TestCaseGroup::TestCaseGroup(pTVar8,testCtx,pcVar9,fullName._M_dataplus._M_p);
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar8;
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::~string((string *)mipLevelAndArrayRangeCases);
    std::__cxx11::string::~string((string *)arrayRangeCases);
    pTVar8 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar8,testCtx,"format","Uses samplable formats");
    formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar8;
    for (lVar14 = 0; lVar14 != 0x75; lVar14 = lVar14 + 1) {
      format = *(VkFormat *)(&DAT_0097e390 + lVar14 * 4);
      bVar6 = ::vk::isCompressedFormat(format);
      if (bVar6 && (viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) break;
      pTVar8 = (TestCaseGroup *)operator_new(0x70);
      pcVar9 = ::vk::getFormatName(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,pcVar9,(allocator<char> *)mipLevelAndArrayRangeCases);
      std::__cxx11::string::substr((ulong)mipLevelAndArrayRangeCases,(ulong)&fullName);
      de::toLower((string *)arrayRangeCases,(string *)mipLevelAndArrayRangeCases);
      std::__cxx11::string::~string((string *)mipLevelAndArrayRangeCases);
      std::__cxx11::string::~string((string *)&fullName);
      pcVar9 = arrayRangeCases[0].name;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)mipLevelAndArrayRangeCases,"Samples a texture of format ",
                 (allocator<char> *)&config_16);
      __rhs = ::vk::getFormatName(format);
      std::operator+(&fullName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     mipLevelAndArrayRangeCases,__rhs);
      tcu::TestCaseGroup::TestCaseGroup(pTVar8,testCtx,pcVar9,fullName._M_dataplus._M_p);
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar8;
      std::__cxx11::string::~string((string *)&fullName);
      std::__cxx11::string::~string((string *)mipLevelAndArrayRangeCases);
      std::__cxx11::string::~string((string *)arrayRangeCases);
      uVar7 = anon_unknown_1::ImageViewTest::getNumLevels(viewType);
      uVar19 = 6;
      if (viewType - VK_IMAGE_VIEW_TYPE_3D < 5) {
        uVar19 = *(uint *)(&DAT_0097e5e8 + (ulong)(viewType - VK_IMAGE_VIEW_TYPE_3D) * 4);
      }
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar10,testCtx,"subresource_range","");
      subresourceRangeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)pTVar10;
      if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
        arrayRangeCases_2[0].name = "lod_base_mip_level";
        arrayRangeCases_2[0].samplerLod = 0.0;
        arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].name = "base_array_layer";
        arrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].subresourceRange.baseMipLevel = 0;
        arrayRangeCases_2[0].subresourceRange.baseMipLevel = 2;
        arrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
        arrayRangeCases[0].subresourceRange.levelCount = uVar7;
        arrayRangeCases[0].subresourceRange.layerCount = uVar19 - 1;
        arrayRangeCases_2[0].subresourceRange.levelCount = uVar7 - 2;
        mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
        mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 5;
        mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
        mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 5;
        mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
        mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 4;
        mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
        mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 4;
        arrayRangeCases_2[0].subresourceRange._12_8_ = (ulong)uVar19 << 0x20;
        arrayRangeCases_2[1].name = "lod_mip_levels";
        arrayRangeCases[1].name = "array_size";
        arrayRangeCases[1].samplerLod = 0.0;
        arrayRangeCases[1].subresourceRange.aspectMask = 1;
        arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases_2[1].samplerLod = 4.0;
        arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].subresourceRange.layerCount = 4;
        arrayRangeCases[2].name = "array_base_and_size";
        arrayRangeCases[2].samplerLod = 0.0;
        arrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases_2[1].subresourceRange.levelCount = 3;
        arrayRangeCases_2[1].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar7 << 0x20;
        arrayRangeCases[2].subresourceRange.baseArrayLayer = 2;
        arrayRangeCases[2].subresourceRange.layerCount = 3;
        config_16.name = "lod_base_mip_level_remaining_levels";
        config_16.samplerLod = 0.0;
        config_16.subresourceRange.aspectMask = 1;
        config_16.subresourceRange.baseMipLevel = 1;
        config_16.subresourceRange.levelCount = 0xffffffff;
        config_16.subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[1].subresourceRange.layerCount = uVar19;
        config_16.subresourceRange.layerCount = uVar19;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel =
             arrayRangeCases_2[0].subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
             arrayRangeCases_2[0].subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel =
             arrayRangeCases_2[0].subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
             arrayRangeCases_2[0].subresourceRange.levelCount;
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases_2[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases_2[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseArrayLayer + lVar16)
          ;
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar5 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0xc0; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&config_16.name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
      }
      else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
        arrayRangeCases_2[0].subresourceRange.levelCount = uVar7 - 2;
        arrayRangeCases[0].name = "base_array_layer";
        arrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
        arrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
        arrayRangeCases[0].subresourceRange.levelCount = uVar7;
        arrayRangeCases[0].subresourceRange.layerCount = uVar19 - 6;
        mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
        mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[0].subresourceRange.baseMipLevel = 2;
        mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
        mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
        arrayRangeCases_2[0].name = "lod_base_mip_level";
        arrayRangeCases_2[0].samplerLod = 0.0;
        arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
        mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 6;
        mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
        mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases_2[0].subresourceRange._12_8_ = (ulong)uVar19 << 0x20;
        arrayRangeCases_2[1].name = "lod_mip_levels";
        arrayRangeCases[1].name = "array_size";
        arrayRangeCases[1].samplerLod = 0.0;
        arrayRangeCases[1].subresourceRange.aspectMask = 1;
        arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases_2[1].samplerLod = 4.0;
        arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].subresourceRange.layerCount = 6;
        arrayRangeCases[2].name = "array_base_and_size";
        arrayRangeCases[2].samplerLod = 0.0;
        arrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases_2[1].subresourceRange.levelCount = 3;
        arrayRangeCases_2[1].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar7 << 0x20;
        arrayRangeCases[2].subresourceRange.baseArrayLayer = 0xc;
        arrayRangeCases[2].subresourceRange.layerCount = 6;
        config_16.name = "lod_base_mip_level_remaining_levels";
        config_16.samplerLod = 0.0;
        config_16.subresourceRange.aspectMask = 1;
        config_16.subresourceRange.baseMipLevel = 1;
        config_16.subresourceRange.levelCount = 0xffffffff;
        config_16.subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[1].subresourceRange.layerCount = uVar19;
        config_16.subresourceRange.layerCount = uVar19;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel =
             arrayRangeCases_2[0].subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
             arrayRangeCases_2[0].subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[0].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[1].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel =
             arrayRangeCases_2[0].subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
             arrayRangeCases_2[0].subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[3].subresourceRange.layerCount =
             mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer;
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases_2[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases_2[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseArrayLayer + lVar16)
          ;
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
                     ,format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar5 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
                     ,format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0xc0; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
                     ,format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&config_16.name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
                     ,format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
      }
      else if (viewType < VK_IMAGE_VIEW_TYPE_3D) {
        config_16.name = "lod_base_mip_level";
        config_16.samplerLod = 0.0;
        config_16.subresourceRange.aspectMask = 1;
        config_16.subresourceRange.baseMipLevel = 2;
        config_16.subresourceRange.levelCount = uVar7 - 2;
        arrayRangeCases_2[0].name = "array_layer_second";
        arrayRangeCases_2[0].samplerLod = 0.0;
        arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[0].subresourceRange.baseMipLevel = 0;
        arrayRangeCases[1].subresourceRange.baseArrayLayer = uVar19 - 1;
        mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
        mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 1;
        mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
        mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
        arrayRangeCases[0].subresourceRange.layerCount = 1;
        mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
        mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[0].subresourceRange.baseArrayLayer = 1;
        arrayRangeCases_2[0].subresourceRange.layerCount = 1;
        arrayRangeCases_2[1].name = "array_layer_last";
        arrayRangeCases_2[1].samplerLod = 0.0;
        arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
        arrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
        arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
        arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].name = "array_layer_last_remaining_layers";
        arrayRangeCases[1].samplerLod = 0.0;
        arrayRangeCases[1].subresourceRange.aspectMask = 1;
        arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        config_16.subresourceRange.baseArrayLayer = 0;
        config_16.subresourceRange.layerCount = 1;
        arrayRangeCases_2[1].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        arrayRangeCases_2[1].subresourceRange.levelCount = uVar7;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 5;
        mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 1;
        mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
        mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
        arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
        arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
        arrayRangeCases[2].samplerLod = 0.0;
        arrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
        arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
        arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
        arrayRangeCases[2].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        arrayRangeCases[1].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[0].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[1].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel =
             config_16.subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
             config_16.subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        mipLevelAndArrayRangeCases[1].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel =
             config_16.subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
             config_16.subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        mipLevelAndArrayRangeCases[3].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&config_16.name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar5 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases_2[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases_2[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseArrayLayer + lVar16)
          ;
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x80; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,viewType,format,
                     config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,&config.subresourceRange)
          ;
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
      }
      else if ((ulong)viewType == 2) {
        arrayRangeCases[0].name = "lod_base_mip_level";
        arrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].subresourceRange.baseMipLevel = 2;
        arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[0].subresourceRange.levelCount = uVar7 - 2;
        arrayRangeCases[1].name = "lod_mip_levels";
        arrayRangeCases[1].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
        mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[1].subresourceRange.aspectMask = 1;
        arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        arrayRangeCases[1].subresourceRange.levelCount = 3;
        arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[1].name = "single_array_layer_remaining_layers";
        mipLevelAndArrayRangeCases[1].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
        mipLevelAndArrayRangeCases[2].name =
             "lod_base_mip_level_single_array_layer_remaining_levels_and_layers";
        mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
        mipLevelAndArrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
        mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
        arrayRangeCases[0].subresourceRange.layerCount = uVar19;
        arrayRangeCases[1].subresourceRange.layerCount = uVar19;
        mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = uVar19;
        mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = uVar7;
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config_16.name = *(char **)((long)&arrayRangeCases[0].name + lVar16);
          uVar1 = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar16);
          uVar2 = *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          uVar3 = *(undefined8 *)
                   ((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          config_16.subresourceRange.baseMipLevel = (deUint32)uVar2;
          config_16.subresourceRange.levelCount = (deUint32)((ulong)uVar2 >> 0x20);
          config_16.subresourceRange.baseArrayLayer = (deUint32)uVar3;
          config_16.subresourceRange.layerCount = (deUint32)((ulong)uVar3 >> 0x20);
          config_16.samplerLod = (float)uVar1;
          config_16.subresourceRange.aspectMask = (VkImageAspectFlags)((ulong)uVar1 >> 0x20);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config_16.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config_16.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config_16.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,arrayRangeCases_2[0].name,VK_IMAGE_VIEW_TYPE_3D,format,
                     config_16.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config_16.subresourceRange);
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)arrayRangeCases_2);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config_16.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar16);
          uVar1 = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar16);
          uVar2 = *(undefined8 *)
                   ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          uVar3 = *(undefined8 *)
                   ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          config_16.subresourceRange.baseMipLevel = (deUint32)uVar2;
          config_16.subresourceRange.levelCount = (deUint32)((ulong)uVar2 >> 0x20);
          config_16.subresourceRange.baseArrayLayer = (deUint32)uVar3;
          config_16.subresourceRange.layerCount = (deUint32)((ulong)uVar3 >> 0x20);
          config_16.samplerLod = (float)uVar1;
          config_16.subresourceRange.aspectMask = (VkImageAspectFlags)((ulong)uVar1 >> 0x20);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config_16.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config_16.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config_16.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,arrayRangeCases_2[0].name,VK_IMAGE_VIEW_TYPE_3D,format,
                     config_16.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config_16.subresourceRange);
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)arrayRangeCases_2);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
      }
      else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE) {
        config_16.name = "lod_base_mip_level";
        config_16.samplerLod = 0.0;
        config_16.subresourceRange.aspectMask = 1;
        config_16.subresourceRange.baseMipLevel = 2;
        arrayRangeCases_2[0].name = "array_layer_second";
        arrayRangeCases_2[0].samplerLod = 0.0;
        arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[0].subresourceRange.baseMipLevel = 0;
        config_16.subresourceRange.levelCount = uVar7 - 2;
        arrayRangeCases_2[0].subresourceRange.baseArrayLayer = 6;
        arrayRangeCases_2[0].subresourceRange.layerCount = 6;
        arrayRangeCases_2[1].name = "array_layer_last";
        arrayRangeCases_2[1].samplerLod = 0.0;
        arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
        arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
        mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
        mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 6;
        mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
        mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
        mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
        arrayRangeCases[0].subresourceRange.layerCount = 6;
        mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
        mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
        mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
        arrayRangeCases[0].samplerLod = 0.0;
        arrayRangeCases[0].subresourceRange.aspectMask = 1;
        arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
        arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
        arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
        arrayRangeCases[1].name = "array_layer_last_remaining_layers";
        arrayRangeCases[1].samplerLod = 0.0;
        arrayRangeCases[1].subresourceRange.aspectMask = 1;
        arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
        config_16.subresourceRange.baseArrayLayer = 0;
        config_16.subresourceRange.layerCount = 6;
        arrayRangeCases[1].subresourceRange.baseArrayLayer = uVar19 - 6;
        arrayRangeCases_2[1].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        arrayRangeCases_2[1].subresourceRange.levelCount = uVar7;
        mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
        mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
        mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
        mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
        arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
        arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
        arrayRangeCases[2].samplerLod = 0.0;
        arrayRangeCases[2].subresourceRange.aspectMask = 1;
        arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
        arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
        arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
        arrayRangeCases[2].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        arrayRangeCases[1].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[0].subresourceRange.levelCount = uVar7;
        arrayRangeCases_2[1].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel =
             config_16.subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
             config_16.subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[1].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel =
             config_16.subresourceRange.baseMipLevel;
        mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
             config_16.subresourceRange.levelCount;
        mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        mipLevelAndArrayRangeCases[2].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
             arrayRangeCases[1].subresourceRange.baseArrayLayer;
        mipLevelAndArrayRangeCases[3].subresourceRange.layerCount =
             arrayRangeCases[0].subresourceRange.layerCount;
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&config_16.name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE,
                     format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar5 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases_2[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases_2[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases_2[0].subresourceRange.baseArrayLayer + lVar16)
          ;
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE,
                     format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0;
            pTVar8 = subresourceRangeTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar16 != 0x80; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)
                ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE,
                     format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
        for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          config.name = *(char **)((long)&arrayRangeCases[0].name + lVar16);
          config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar16);
          config.subresourceRange._4_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar16);
          config.subresourceRange._12_8_ =
               *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar16);
          poVar11 = std::operator<<((ostream *)&fullName,"Samples level ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,config.samplerLod);
          poVar11 = std::operator<<(poVar11," with :\n");
          ::vk::operator<<(poVar11,&config.subresourceRange);
          pIVar12 = (ImageViewTest *)operator_new(0xa0);
          pcVar9 = config.name;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (pIVar12,testCtx,pcVar9,
                     (char *)componentMappings.
                             super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start,VK_IMAGE_VIEW_TYPE_CUBE,
                     format,config.samplerLod,(VkComponentMapping *)&DAT_0096aed0,
                     &config.subresourceRange);
          tcu::TestNode::addChild(&pTVar8->super_TestNode,(TestNode *)pIVar12);
          std::__cxx11::string::~string((string *)&componentMappings);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        }
      }
      dVar15 = 0;
      if (viewType < VK_IMAGE_VIEW_TYPE_LAST) {
        dVar15 = *(deUint32 *)(&DAT_0097e594 + (ulong)viewType * 4);
      }
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.levelCount = anon_unknown_1::ImageViewTest::getNumLevels(viewType);
      subresourceRange.baseArrayLayer = 0;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      subresourceRange.layerCount = dVar15;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      fullName._M_dataplus._M_p = (pointer)0x400000003;
      fullName._M_string_length = 0x600000005;
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          *(undefined4 *)((long)&mipLevelAndArrayRangeCases[0].name + lVar13 * 4) =
               *(undefined4 *)
                ((long)&fullName._M_dataplus._M_p + (ulong)((int)lVar16 + (int)lVar13 & 3) * 4);
        }
        arrayRangeCases[0].name = mipLevelAndArrayRangeCases[0].name;
        arrayRangeCases[0].samplerLod = mipLevelAndArrayRangeCases[0].samplerLod;
        arrayRangeCases[0].subresourceRange.aspectMask =
             mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask;
        std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::push_back
                  (&componentMappings,(value_type *)arrayRangeCases);
      }
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar10,testCtx,"component_swizzle","");
      lVar16 = 0;
      componentSwizzleTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)pTVar10;
      for (uVar18 = 0;
          pVVar4 = componentMappings.
                   super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)componentMappings.
                                 super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)componentMappings.
                                 super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar18 = uVar18 + 1) {
        pIVar12 = (ImageViewTest *)operator_new(0xa0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
        (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                  ((string *)mipLevelAndArrayRangeCases,
                   (_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar4->r + lVar16),
                   componentSwizzle);
        poVar11 = std::operator<<((ostream *)&fullName,(string *)mipLevelAndArrayRangeCases);
        poVar11 = std::operator<<(poVar11,"_");
        (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                  ((string *)arrayRangeCases,
                   (_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar4->g + lVar16),
                   componentSwizzle_00);
        poVar11 = std::operator<<(poVar11,(string *)arrayRangeCases);
        poVar11 = std::operator<<(poVar11,"_");
        (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                  ((string *)&config_16,
                   (_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar4->b + lVar16),
                   componentSwizzle_01);
        poVar11 = std::operator<<(poVar11,(string *)&config_16);
        poVar11 = std::operator<<(poVar11,"_");
        (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                  ((string *)arrayRangeCases_2,
                   (_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar4->a + lVar16),
                   componentSwizzle_02);
        std::operator<<(poVar11,(string *)arrayRangeCases_2);
        std::__cxx11::string::~string((string *)arrayRangeCases_2);
        std::__cxx11::string::~string((string *)&config_16);
        std::__cxx11::string::~string((string *)arrayRangeCases);
        std::__cxx11::string::~string((string *)mipLevelAndArrayRangeCases);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
        anon_unknown_1::ImageViewTest::ImageViewTest
                  (pIVar12,testCtx,config.name,"",viewType,format,0.0,
                   (VkComponentMapping *)
                   ((long)&(componentMappings.
                            super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                            ._M_impl.super__Vector_impl_data._M_start)->r + lVar16),
                   &subresourceRange);
        tcu::TestNode::addChild(pTVar10,(TestNode *)pIVar12);
        std::__cxx11::string::~string((string *)&config);
        lVar16 = lVar16 + 0x10;
      }
      std::_Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::
      ~_Vector_base(&componentMappings.
                     super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                   );
      pTVar8 = componentSwizzleTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      componentSwizzleTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
      pTVar8 = subresourceRangeTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      subresourceRangeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
      pTVar8 = formatGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&componentSwizzleTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&subresourceRangeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    }
    pTVar8 = formatTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
    pTVar8 = viewTypeGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(viewTypeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar8->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&formatTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageViewTests (tcu::TestContext& testCtx)
{
	const struct
	{
		VkImageViewType		type;
		const char*			name;
	}
	imageViewTypes[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D,			"1d" },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		"1d_array" },
		{ VK_IMAGE_VIEW_TYPE_2D,			"2d" },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		"2d_array" },
		{ VK_IMAGE_VIEW_TYPE_3D,			"3d" },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			"cube" },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	"cube_array" }
	};

	const VkFormat formats[] =
	{
		VK_FORMAT_R4G4_UNORM_PACK8,
		VK_FORMAT_R4G4B4A4_UNORM_PACK16,
		VK_FORMAT_R5G6B5_UNORM_PACK16,
		VK_FORMAT_R5G5B5A1_UNORM_PACK16,
		VK_FORMAT_R8_UNORM,
		VK_FORMAT_R8_SNORM,
		VK_FORMAT_R8_USCALED,
		VK_FORMAT_R8_SSCALED,
		VK_FORMAT_R8_UINT,
		VK_FORMAT_R8_SINT,
		VK_FORMAT_R8_SRGB,
		VK_FORMAT_R8G8_UNORM,
		VK_FORMAT_R8G8_SNORM,
		VK_FORMAT_R8G8_USCALED,
		VK_FORMAT_R8G8_SSCALED,
		VK_FORMAT_R8G8_UINT,
		VK_FORMAT_R8G8_SINT,
		VK_FORMAT_R8G8_SRGB,
		VK_FORMAT_R8G8B8_UNORM,
		VK_FORMAT_R8G8B8_SNORM,
		VK_FORMAT_R8G8B8_USCALED,
		VK_FORMAT_R8G8B8_SSCALED,
		VK_FORMAT_R8G8B8_UINT,
		VK_FORMAT_R8G8B8_SINT,
		VK_FORMAT_R8G8B8_SRGB,
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R8G8B8A8_SNORM,
		VK_FORMAT_R8G8B8A8_USCALED,
		VK_FORMAT_R8G8B8A8_SSCALED,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R8G8B8A8_SRGB,
		VK_FORMAT_A2R10G10B10_UNORM_PACK32,
		VK_FORMAT_A2R10G10B10_UINT_PACK32,
		VK_FORMAT_A2B10G10R10_USCALED_PACK32,
		VK_FORMAT_R16_UNORM,
		VK_FORMAT_R16_SNORM,
		VK_FORMAT_R16_USCALED,
		VK_FORMAT_R16_SSCALED,
		VK_FORMAT_R16_UINT,
		VK_FORMAT_R16_SINT,
		VK_FORMAT_R16_SFLOAT,
		VK_FORMAT_R16G16_UNORM,
		VK_FORMAT_R16G16_SNORM,
		VK_FORMAT_R16G16_USCALED,
		VK_FORMAT_R16G16_SSCALED,
		VK_FORMAT_R16G16_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R16G16_SFLOAT,
		VK_FORMAT_R16G16B16_UNORM,
		VK_FORMAT_R16G16B16_SNORM,
		VK_FORMAT_R16G16B16_USCALED,
		VK_FORMAT_R16G16B16_SSCALED,
		VK_FORMAT_R16G16B16_UINT,
		VK_FORMAT_R16G16B16_SINT,
		VK_FORMAT_R16G16B16_SFLOAT,
		VK_FORMAT_R16G16B16A16_UNORM,
		VK_FORMAT_R16G16B16A16_SNORM,
		VK_FORMAT_R16G16B16A16_USCALED,
		VK_FORMAT_R16G16B16A16_SSCALED,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R32_SINT,
		VK_FORMAT_R32_SFLOAT,
		VK_FORMAT_R32G32_UINT,
		VK_FORMAT_R32G32_SINT,
		VK_FORMAT_R32G32_SFLOAT,
		VK_FORMAT_R32G32B32_UINT,
		VK_FORMAT_R32G32B32_SINT,
		VK_FORMAT_R32G32B32_SFLOAT,
		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_B10G11R11_UFLOAT_PACK32,
		VK_FORMAT_E5B9G9R9_UFLOAT_PACK32,
		VK_FORMAT_B4G4R4A4_UNORM_PACK16,
		VK_FORMAT_B5G5R5A1_UNORM_PACK16,

		// Compressed formats
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x12_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	de::MovePtr<tcu::TestCaseGroup> imageTests			(new tcu::TestCaseGroup(testCtx, "image_view", "Image tests"));
	de::MovePtr<tcu::TestCaseGroup> viewTypeTests		(new tcu::TestCaseGroup(testCtx, "view_type", ""));

	for (int viewTypeNdx = 0; viewTypeNdx < DE_LENGTH_OF_ARRAY(imageViewTypes); viewTypeNdx++)
	{
		const VkImageViewType			viewType		= imageViewTypes[viewTypeNdx].type;
		de::MovePtr<tcu::TestCaseGroup>	viewTypeGroup	(new tcu::TestCaseGroup(testCtx, imageViewTypes[viewTypeNdx].name, (std::string("Uses a ") + imageViewTypes[viewTypeNdx].name + " view").c_str()));
		de::MovePtr<tcu::TestCaseGroup>	formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses samplable formats"));

		for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			const VkFormat		format		= formats[formatNdx];

			if (isCompressedFormat(format))
			{
				// Do not use compressed formats with 1D and 1D array textures.
				if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)
					break;
			}

			de::MovePtr<tcu::TestCaseGroup>	formatGroup	(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(format).c_str(),
																				(std::string("Samples a texture of format ") + getFormatName(format)).c_str()));

			de::MovePtr<tcu::TestCaseGroup>	subresourceRangeTests	= createSubresourceRangeTests(testCtx, viewType, format);
			de::MovePtr<tcu::TestCaseGroup>	componentSwizzleTests	= createComponentSwizzleTests(testCtx, viewType, format);

			formatGroup->addChild(componentSwizzleTests.release());
			formatGroup->addChild(subresourceRangeTests.release());
			formatTests->addChild(formatGroup.release());
		}

		viewTypeGroup->addChild(formatTests.release());
		viewTypeTests->addChild(viewTypeGroup.release());
	}

	imageTests->addChild(viewTypeTests.release());

	return imageTests.release();
}